

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall KDIS::NETWORK::Connection::startup(Connection *this)

{
  int iVar1;
  KException *this_00;
  int *piVar2;
  KCHAR8 *__s;
  allocator<char> local_45 [13];
  KString local_38;
  char local_11;
  Connection *pCStack_10;
  KINT8 i;
  Connection *this_local;
  
  if ((this->m_iSocket[0] == 0) && (this->m_iSocket[1] == 0)) {
    pCStack_10 = this;
    for (local_11 = '\0'; local_11 < '\x02'; local_11 = local_11 + '\x01') {
      iVar1 = socket(2,2,0x11);
      this->m_iSocket[local_11] = iVar1;
      if (this->m_iSocket[local_11] == -1) {
        this_00 = (KException *)__cxa_allocate_exception(0x30);
        piVar2 = __errno_location();
        __s = getErrorText(this,*piVar2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,local_45);
        KException::KException(this_00,&local_38,0xc);
        __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
      }
    }
    if ((this->m_bSendOnly & 1U) == 0) {
      bindSocket(this);
    }
  }
  return;
}

Assistant:

void Connection::startup() noexcept(false)
{
    // Create the sockets if they do not already exist.
    if( !m_iSocket[SEND_SOCK] && !m_iSocket[RECEIVE_SOCK] )
    {
        // Windows only //
#if defined( WIN32 ) | defined( _WIN32 ) | defined( WIN64 ) | defined( _WIN64 )
        WSADATA w;
        static KINT32 iWinSockInit = WSAStartup( 0x0202, &w ); // Init with winsock version 2.2
        if( iWinSockInit != NO_ERROR )
        {
            THROW_ERROR;
        }
#endif

        // Create both sockets
        for( KINT8 i = 0; i < 2; ++i )
        {
            m_iSocket[i] = socket( AF_INET, SOCK_DGRAM, IPPROTO_UDP ); // Create a IPv4 UDP socket.

            if( m_iSocket[i] == INVALID_SOCKET )
            {
                THROW_ERROR;
            }
        }

        // Bind socket for incoming data.
        if( !m_bSendOnly )
            bindSocket();
    }
}